

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O0

uint ON_MeshNgon::FindNgonBoundaries
               (ON_3dPointListRef *mesh_vertex_list,ON_MeshFaceList *mesh_face_list,
               ON_MeshVertexFaceMap *vertex_face_map,size_t ngon_fi_count,uint *ngon_fi,
               ON_SimpleArray<unsigned_int> *ngon_vi,ON_SimpleArray<unsigned_int> *ngon_vi_markers)

{
  uint uVar1;
  ON_SimpleArray<unsigned_int> *ngon_vi_local;
  uint *ngon_fi_local;
  size_t ngon_fi_count_local;
  ON_MeshVertexFaceMap *vertex_face_map_local;
  ON_MeshFaceList *mesh_face_list_local;
  ON_3dPointListRef *mesh_vertex_list_local;
  
  uVar1 = FindNgonBoundaries_Helper
                    (mesh_vertex_list,mesh_face_list,(uint **)0x0,vertex_face_map,ngon_fi_count,
                     ngon_fi,ngon_vi,ngon_vi_markers,false);
  return uVar1;
}

Assistant:

unsigned int ON_MeshNgon::FindNgonBoundaries(
  const class ON_3dPointListRef& mesh_vertex_list,
  const class ON_MeshFaceList& mesh_face_list,
  ON_MeshVertexFaceMap* vertex_face_map,
  size_t ngon_fi_count,
  const unsigned int* ngon_fi,
  ON_SimpleArray<unsigned int>& ngon_vi,
  ON_SimpleArray<unsigned int>& ngon_vi_markers
)
{
  return FindNgonBoundaries_Helper(
    mesh_vertex_list,
    mesh_face_list,
    nullptr,
    vertex_face_map,
    ngon_fi_count,
    ngon_fi,
    ngon_vi,
    ngon_vi_markers,
    false
  );
}